

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O0

int __thiscall
ncnn::Yolov3DetectionOutput::forward
          (Yolov3DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  __normal_iterator<const_ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
  __last;
  __normal_iterator<const_ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
  __first;
  const_iterator __position;
  ulong uVar1;
  size_type sVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  float *pfVar7;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  float fVar8;
  double dVar9;
  double dVar10;
  float *outptr;
  float score_1;
  BBoxRect *r;
  int i_3;
  Mat *top_blob;
  int num_detected;
  size_t z;
  size_t i_2;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *box_bbox_rects;
  int i_1;
  BBoxRect c;
  float area;
  float bbox_ymax;
  float bbox_xmax;
  float bbox_ymin;
  float bbox_xmin;
  float bbox_h;
  float bbox_w;
  float bbox_cy;
  float bbox_cx;
  float confidence;
  float score;
  int q;
  float class_score;
  int class_index;
  int j;
  int i;
  Mat scores;
  float *box_score_ptr;
  float *hptr;
  float *wptr;
  float *yptr;
  float *xptr;
  float bias_h;
  float bias_w;
  int biases_index;
  int p;
  int pp;
  int net_h;
  int net_w;
  size_t mask_offset;
  int channels_per_box;
  int channels;
  int h;
  int w;
  Mat *bottom_top_blobs;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  all_box_bbox_rects;
  size_t b;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Mat *m_5;
  Mat *m_6;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *in_stack_fffffffffffff478;
  undefined7 in_stack_fffffffffffff480;
  undefined1 in_stack_fffffffffffff487;
  value_type *in_stack_fffffffffffff488;
  undefined7 in_stack_fffffffffffff490;
  undefined1 in_stack_fffffffffffff497;
  size_type in_stack_fffffffffffff498;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  *in_stack_fffffffffffff4a0;
  Mat *this_00;
  float in_stack_fffffffffffff4bc;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *in_stack_fffffffffffff4c0;
  undefined4 in_stack_fffffffffffff4c8;
  float in_stack_fffffffffffff4cc;
  float in_stack_fffffffffffff4d0;
  float in_stack_fffffffffffff4d4;
  float in_stack_fffffffffffff4d8;
  float in_stack_fffffffffffff4dc;
  int local_9ac;
  size_type local_990;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_988;
  undefined1 local_970 [32];
  BBoxRect *local_950;
  BBoxRect *local_948;
  BBoxRect *local_940;
  reference local_930;
  int local_928;
  float local_924;
  float local_920;
  float local_91c;
  float local_918;
  float local_914;
  float local_910;
  int local_90c;
  float local_908;
  float local_904;
  float local_900;
  float local_8fc;
  float local_8f8;
  float local_8f4;
  float local_8f0;
  float local_8ec;
  float local_8e8;
  float local_8e4;
  undefined8 local_8e0;
  undefined8 local_8d8;
  undefined8 local_8d0;
  undefined4 local_8c8;
  Allocator *local_8c0;
  undefined4 local_8b8;
  undefined4 local_8b4;
  undefined4 local_8b0;
  undefined4 local_8ac;
  undefined4 local_8a8;
  undefined8 local_8a0;
  float local_898;
  int local_894;
  float local_890;
  int local_88c;
  int local_888;
  int local_884;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_880;
  int local_868;
  Allocator *local_860;
  int local_858;
  int local_854;
  int local_850;
  int local_84c;
  undefined4 local_848;
  ulong local_840;
  undefined8 local_838;
  undefined8 local_830;
  undefined8 local_828;
  undefined4 local_820;
  Allocator *local_818;
  undefined4 local_810;
  undefined4 local_80c;
  undefined4 local_808;
  undefined4 local_804;
  undefined4 local_800;
  undefined8 local_7f8;
  uint *local_7f0;
  undefined8 local_7e8;
  undefined8 local_7e0;
  undefined8 local_7d8;
  undefined4 local_7d0;
  Allocator *local_7c8;
  undefined4 local_7c0;
  undefined4 local_7bc;
  undefined4 local_7b8;
  undefined4 local_7b4;
  undefined4 local_7b0;
  undefined8 local_7a8;
  uint *local_7a0;
  undefined8 local_798;
  undefined8 local_790;
  undefined8 local_788;
  undefined4 local_780;
  Allocator *local_778;
  undefined4 local_770;
  undefined4 local_76c;
  undefined4 local_768;
  undefined4 local_764;
  undefined4 local_760;
  undefined8 local_758;
  uint *local_750;
  undefined8 local_748;
  undefined8 local_740;
  undefined8 local_738;
  undefined4 local_730;
  Allocator *local_728;
  undefined4 local_720;
  undefined4 local_71c;
  undefined4 local_718;
  undefined4 local_714;
  undefined4 local_710;
  undefined8 local_708;
  void *local_700;
  undefined8 local_6f8;
  undefined8 local_6f0;
  undefined8 local_6e8;
  undefined4 local_6e0;
  Allocator *local_6d8;
  undefined4 local_6d0;
  undefined4 local_6cc;
  undefined4 local_6c8;
  undefined4 local_6c4;
  undefined4 local_6c0;
  undefined8 local_6b8;
  void *local_6b0;
  float local_6a4;
  float local_6a0;
  int local_69c;
  int local_698;
  int local_694;
  int local_690;
  int local_68c;
  long local_688;
  int local_67c;
  int local_678;
  int local_674;
  int local_670;
  int local_66c;
  const_reference local_668;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  local_650;
  ulong local_638;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_630;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_610;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_608;
  int local_5f4;
  undefined8 *local_5f0;
  undefined8 *local_5e0;
  undefined8 *local_5d0;
  undefined8 *local_5c0;
  undefined8 *local_5b0;
  undefined8 *local_5a0;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *local_590;
  long local_580;
  long *local_578;
  long local_570;
  long *local_568;
  long local_560;
  long *local_558;
  ulong local_550;
  long *local_548;
  ulong local_540;
  long *local_538;
  undefined1 local_52d;
  int local_52c;
  const_reference local_528;
  undefined8 *local_520;
  undefined1 local_50d;
  int local_50c;
  const_reference local_508;
  undefined8 *local_500;
  undefined1 local_4ed;
  int local_4ec;
  const_reference local_4e8;
  undefined8 *local_4e0;
  undefined1 local_4cd;
  int local_4cc;
  const_reference local_4c8;
  undefined8 *local_4c0;
  undefined1 local_4ad;
  int local_4ac;
  const_reference local_4a8;
  undefined8 *local_4a0;
  undefined8 *local_490;
  undefined8 *local_488;
  undefined8 *local_480;
  undefined8 *local_478;
  undefined8 *local_470;
  undefined1 local_461;
  undefined4 local_460;
  int local_45c;
  const_reference local_458;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *local_450;
  undefined1 local_43d;
  int local_43c;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *local_438;
  undefined8 *local_430;
  int local_41c;
  reference local_418;
  int local_40c;
  undefined8 *local_408;
  reference local_400;
  float local_378;
  undefined4 local_374;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *local_370;
  undefined8 *local_350;
  undefined8 *local_330;
  undefined8 *local_310;
  undefined8 *local_2f0;
  undefined8 *local_2d0;
  undefined8 *local_2b0;
  pointer local_248;
  Allocator *local_200;
  int local_1f4;
  pointer local_1f0;
  float *local_1e8;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  undefined8 *local_1d0;
  Allocator *local_1c8;
  int local_1bc;
  size_t local_1b8;
  void *local_1b0;
  int local_1a4;
  int local_1a0;
  int local_19c;
  undefined8 *local_198;
  Allocator *local_190;
  int local_184;
  size_t local_180;
  void *local_178;
  int local_16c;
  int local_168;
  int local_164;
  undefined8 *local_160;
  Allocator *local_158;
  int local_14c;
  size_t local_148;
  uint *local_140;
  int local_134;
  int local_130;
  int local_12c;
  undefined8 *local_128;
  Allocator *local_120;
  int local_114;
  size_t local_110;
  uint *local_108;
  int local_fc;
  int local_f8;
  int local_f4;
  undefined8 *local_f0;
  Allocator *local_e8;
  int local_dc;
  size_t local_d8;
  uint *local_d0;
  int local_c4;
  int local_c0;
  int local_bc;
  undefined8 *local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  Allocator *local_50;
  int local_44;
  pointer local_40;
  pointer local_38;
  undefined4 local_30;
  int local_2c;
  int local_28;
  int local_24;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *local_20;
  undefined4 local_14;
  long local_10;
  reference local_8;
  
  local_610 = in_RDX;
  local_608 = in_RSI;
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            *)0x1a2d8e4);
  for (local_638 = 0; uVar1 = local_638,
      sVar2 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_608), uVar1 < sVar2;
      local_638 = local_638 + 1) {
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              *)0x1a2d936);
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::resize(in_stack_fffffffffffff4a0,in_stack_fffffffffffff498);
    local_668 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_608,local_638);
    local_66c = local_668->w;
    local_670 = local_668->h;
    local_674 = local_668->c;
    local_678 = local_674 / *(int *)(in_RDI + 0xd4);
    if (local_678 == *(int *)(in_RDI + 0xd0) + 5) {
      local_688 = local_638 * (long)*(int *)(in_RDI + 0xd4);
      local_538 = (long *)(in_RDI + 0x170);
      local_540 = local_638;
      local_68c = (int)(*(float *)(*local_538 + local_638 * 4) * (float)local_66c);
      local_548 = (long *)(in_RDI + 0x170);
      local_550 = local_638;
      local_690 = (int)(*(float *)(*local_548 + local_638 * 4) * (float)local_670);
      for (local_694 = 0; local_694 < *(int *)(in_RDI + 0xd4); local_694 = local_694 + 1) {
        local_698 = local_694 * local_678;
        local_558 = (long *)(in_RDI + 0x128);
        local_560 = local_694 + local_688;
        local_69c = (int)*(float *)(*local_558 + local_560 * 4);
        local_568 = (long *)(in_RDI + 0xe0);
        local_570 = (long)(local_69c << 1);
        local_6a0 = *(float *)(*local_568 + local_570 * 4);
        local_578 = (long *)(in_RDI + 0xe0);
        local_580 = (long)(local_69c * 2 + 1);
        local_6a4 = *(float *)(*local_578 + local_580 * 4);
        local_4a0 = &local_6f8;
        local_19c = local_668->w;
        local_1a0 = local_668->h;
        local_1a4 = local_668->d;
        local_6b0 = (void *)((long)local_668->data +
                            local_668->cstep * (long)local_698 * local_668->elemsize);
        local_1b8 = local_668->elemsize;
        local_1bc = local_668->elempack;
        local_1c8 = local_668->allocator;
        local_198 = &local_6f8;
        local_68 = (long)local_19c * (long)local_1a0 * local_1b8;
        local_470 = &local_6f8;
        local_5f0 = &local_6f8;
        local_4cc = local_698 + 1;
        local_4c0 = &local_748;
        local_164 = local_668->w;
        local_168 = local_668->h;
        local_16c = local_668->d;
        local_700 = (void *)((long)local_668->data +
                            local_668->cstep * (long)local_4cc * local_668->elemsize);
        local_180 = local_668->elemsize;
        local_184 = local_668->elempack;
        local_190 = local_668->allocator;
        local_160 = &local_748;
        local_78 = (long)local_164 * (long)local_168 * local_180;
        local_478 = &local_748;
        local_5e0 = &local_748;
        local_4ec = local_698 + 2;
        local_4e0 = &local_798;
        local_12c = local_668->w;
        local_130 = local_668->h;
        local_134 = local_668->d;
        local_750 = (uint *)((long)local_668->data +
                            local_668->cstep * (long)local_4ec * local_668->elemsize);
        local_148 = local_668->elemsize;
        local_14c = local_668->elempack;
        local_158 = local_668->allocator;
        local_128 = &local_798;
        local_88 = (long)local_12c * (long)local_130 * local_148;
        local_480 = &local_798;
        local_5d0 = &local_798;
        local_50c = local_698 + 3;
        local_500 = &local_7e8;
        local_f4 = local_668->w;
        local_f8 = local_668->h;
        local_fc = local_668->d;
        local_7a0 = (uint *)((long)local_668->data +
                            local_668->cstep * (long)local_50c * local_668->elemsize);
        local_110 = local_668->elemsize;
        local_114 = local_668->elempack;
        local_120 = local_668->allocator;
        local_f0 = &local_7e8;
        local_98 = (long)local_f4 * (long)local_f8 * local_110;
        local_488 = &local_7e8;
        local_5c0 = &local_7e8;
        local_52c = local_698 + 4;
        local_520 = &local_838;
        local_bc = local_668->w;
        local_c0 = local_668->h;
        local_c4 = local_668->d;
        local_7f0 = (uint *)((long)local_668->data +
                            local_668->cstep * (long)local_52c * local_668->elemsize);
        local_d8 = local_668->elemsize;
        local_dc = local_668->elempack;
        local_e8 = local_668->allocator;
        local_b8 = &local_838;
        local_a8 = (long)local_bc * (long)local_c0 * local_d8;
        local_490 = &local_838;
        local_5b0 = &local_838;
        local_6c0 = 0;
        local_6c4 = 0;
        local_6c8 = 0;
        local_6cc = 0;
        local_6e0 = 0;
        local_6e8 = 0;
        local_6f0 = 0;
        local_6f8 = 0;
        local_710 = 0;
        local_714 = 0;
        local_718 = 0;
        local_71c = 0;
        local_730 = 0;
        local_738 = 0;
        local_740 = 0;
        local_748 = 0;
        local_760 = 0;
        local_764 = 0;
        local_768 = 0;
        local_76c = 0;
        local_780 = 0;
        local_788 = 0;
        local_790 = 0;
        local_798 = 0;
        local_7b0 = 0;
        local_7b4 = 0;
        local_7b8 = 0;
        local_7bc = 0;
        local_7d0 = 0;
        local_7d8 = 0;
        local_7e0 = 0;
        local_7e8 = 0;
        local_6c = 0x10;
        local_7c = 0x10;
        local_8c = 0x10;
        local_9c = 0x10;
        local_ac = 0x10;
        local_4a8 = local_668;
        local_4ad = 1;
        local_4c8 = local_668;
        local_4cd = 1;
        local_4e8 = local_668;
        local_4ed = 1;
        local_508 = local_668;
        local_50d = 1;
        local_528 = local_668;
        local_52d = 1;
        local_6b8 = 0;
        local_6d0 = 0;
        local_708 = 0;
        local_720 = 0;
        local_758 = 0;
        local_770 = 0;
        local_7a8 = 0;
        local_7c0 = 0;
        local_838 = 0;
        local_828 = 0;
        local_820 = 0;
        local_80c = 0;
        local_808 = 0;
        local_804 = 0;
        local_800 = 0;
        local_830 = 0;
        local_45c = local_698 + 5;
        local_460 = *(undefined4 *)(in_RDI + 0xd0);
        local_450 = &local_880;
        local_24 = local_668->w;
        local_28 = local_668->h;
        local_2c = local_668->d;
        local_38 = (pointer)((long)local_668->data +
                            local_668->cstep * (long)local_45c * local_668->elemsize);
        local_40 = (pointer)local_668->elemsize;
        local_44 = local_668->elempack;
        local_50 = local_668->allocator;
        local_20 = &local_880;
        local_880.
        super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_10 = (long)local_24 * (long)local_28 * (long)local_2c * (long)local_40;
        local_840 = (local_10 + 0xfU & 0xfffffffffffffff0) / (ulong)local_40;
        local_858 = local_668->dims;
        local_14 = 0x10;
        local_458 = local_668;
        local_461 = 1;
        local_7f8 = 0;
        local_810 = 0;
        local_4ac = local_698;
        local_330 = local_5b0;
        local_310 = local_5c0;
        local_2f0 = local_5d0;
        local_2d0 = local_5e0;
        local_2b0 = local_5f0;
        local_1b0 = local_6b0;
        local_178 = local_700;
        local_140 = local_750;
        local_108 = local_7a0;
        local_d0 = local_7f0;
        local_30 = local_460;
        local_880.
        super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        ._M_impl.super__Vector_impl_data._M_start = local_38;
        local_880.
        super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_40;
        local_868 = local_44;
        local_860 = local_50;
        local_854 = local_24;
        local_850 = local_28;
        local_84c = local_2c;
        local_848 = local_460;
        local_818 = local_e8;
        local_7c8 = local_120;
        local_778 = local_158;
        local_728 = local_190;
        local_6d8 = local_1c8;
        for (local_884 = 0; local_884 < local_670; local_884 = local_884 + 1) {
          for (local_888 = 0; local_888 < local_66c; local_888 = local_888 + 1) {
            local_88c = 0;
            local_890 = -3.4028235e+38;
            for (local_894 = 0; local_894 < *(int *)(in_RDI + 0xd0); local_894 = local_894 + 1) {
              local_430 = &local_8e0;
              local_438 = &local_880;
              local_1e8 = (float *)((long)&(local_880.
                                            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->score +
                                   local_840 * (long)local_894 *
                                   (long)local_880.
                                         super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
              local_1d0 = &local_8e0;
              local_8c0 = local_860;
              local_58 = (long)local_854 * (long)local_850 *
                         (long)local_880.
                               super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_5c = 0x10;
              local_1d4 = local_854;
              local_1d8 = local_850;
              local_1dc = local_84c;
              local_1f0 = local_880.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage;
              local_1f4 = local_868;
              local_200 = local_860;
              local_43c = local_894;
              local_43d = 1;
              local_408 = &local_8e0;
              local_40c = local_884;
              local_898 = *(float *)((long)local_1e8 +
                                    (long)local_888 * 4 +
                                    (long)local_854 * (long)local_884 *
                                    (long)local_880.
                                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              local_5a0 = &local_8e0;
              local_8e0 = 0;
              local_8d0 = 0;
              local_8c8 = 0;
              local_8b8 = 0;
              local_8b4 = 0;
              local_8b0 = 0;
              local_8ac = 0;
              local_8a8 = 0;
              local_8a0 = 0;
              local_8d8 = 0;
              if (local_890 < local_898) {
                local_88c = local_894;
                local_890 = local_898;
              }
              local_350 = local_5a0;
            }
            dVar9 = std::exp((double)((ulong)*local_7f0 ^ 0x8000000080000000));
            dVar10 = std::exp((double)((ulong)(uint)local_890 ^ 0x8000000080000000));
            local_8e4 = 1.0 / (SUB84(dVar9,0) * (SUB84(dVar10,0) + 1.0) + 1.0);
            if (*(float *)(in_RDI + 0xd8) <= local_8e4) {
              in_stack_fffffffffffff4dc = (float)local_888;
              fVar8 = sigmoid(0.0);
              local_8e8 = (in_stack_fffffffffffff4dc + fVar8) / (float)local_66c;
              in_stack_fffffffffffff4d4 = (float)local_884;
              in_stack_fffffffffffff4d8 = sigmoid(0.0);
              local_8ec = (in_stack_fffffffffffff4d4 + in_stack_fffffffffffff4d8) / (float)local_670
              ;
              dVar9 = std::exp((double)(ulong)*local_750);
              in_stack_fffffffffffff4d0 = SUB84(dVar9,0);
              local_8f0 = (in_stack_fffffffffffff4d0 * local_6a0) / (float)local_68c;
              dVar9 = std::exp((double)(ulong)*local_7a0);
              in_stack_fffffffffffff4cc = SUB84(dVar9,0);
              local_8f4 = (in_stack_fffffffffffff4cc * local_6a4) / (float)local_690;
              local_920 = local_8e8 - local_8f0 * 0.5;
              local_91c = local_8ec - local_8f4 * 0.5;
              local_918 = local_8e8 + local_8f0 * 0.5;
              local_914 = local_8ec + local_8f4 * 0.5;
              local_910 = local_8f0 * local_8f4;
              local_924 = local_8e4;
              local_90c = local_88c;
              local_908 = local_910;
              local_904 = local_914;
              local_900 = local_918;
              local_8fc = local_91c;
              local_8f8 = local_920;
              std::
              vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              ::operator[](&local_650,(long)local_694);
              std::
              vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
              ::push_back((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                           *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                          in_stack_fffffffffffff488);
            }
            local_6b0 = (void *)((long)local_6b0 + 4);
            local_700 = (void *)((long)local_700 + 4);
            local_750 = local_750 + 1;
            local_7a0 = local_7a0 + 1;
            local_7f0 = local_7f0 + 1;
          }
        }
        in_stack_fffffffffffff4c0 = &local_880;
        local_590 = in_stack_fffffffffffff4c0;
        local_370 = in_stack_fffffffffffff4c0;
        if (local_880.
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
          local_374 = 0xffffffff;
          LOCK();
          local_378 = (local_880.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                       ._M_impl.super__Vector_impl_data._M_finish)->score;
          (local_880.
           super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
           ._M_impl.super__Vector_impl_data._M_finish)->score =
               (float)((int)(local_880.
                             super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                             ._M_impl.super__Vector_impl_data._M_finish)->score + -1);
          UNLOCK();
          if (local_378 == 1.4013e-45) {
            if (local_860 == (Allocator *)0x0) {
              local_248 = local_880.
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              if (local_880.
                  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                free(local_880.
                     super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     ._M_impl.super__Vector_impl_data._M_start);
              }
            }
            else {
              (*local_860->_vptr_Allocator[3])
                        (local_860,
                         local_880.
                         super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         ._M_impl.super__Vector_impl_data._M_start);
            }
          }
        }
        (in_stack_fffffffffffff4c0->
        super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (in_stack_fffffffffffff4c0->
        super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        *(undefined4 *)
         &in_stack_fffffffffffff4c0[1].
          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
          ._M_impl.super__Vector_impl_data._M_start = 0;
        *(undefined4 *)
         &in_stack_fffffffffffff4c0[1].
          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = 0;
        *(undefined4 *)
         ((long)&in_stack_fffffffffffff4c0[1].
                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
        *(undefined4 *)
         &in_stack_fffffffffffff4c0[2].
          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
          ._M_impl.super__Vector_impl_data._M_start = 0;
        *(undefined4 *)
         ((long)&in_stack_fffffffffffff4c0[2].
                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
        *(undefined4 *)
         &in_stack_fffffffffffff4c0[2].
          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
          ._M_impl.super__Vector_impl_data._M_finish = 0;
        in_stack_fffffffffffff4c0[2].
        super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (in_stack_fffffffffffff4c0->
        super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      }
      for (local_928 = 0; local_928 < *(int *)(in_RDI + 0xd4); local_928 = local_928 + 1) {
        local_930 = std::
                    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                    ::operator[](&local_650,(long)local_928);
        local_940 = (BBoxRect *)
                    std::
                    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ::end(in_stack_fffffffffffff478);
        __gnu_cxx::
        __normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>
        ::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect*>
                  ((__normal_iterator<const_ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
                    *)CONCAT17(in_stack_fffffffffffff487,in_stack_fffffffffffff480),
                   (__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
                    *)in_stack_fffffffffffff478);
        local_948 = (BBoxRect *)
                    std::
                    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ::begin(in_stack_fffffffffffff478);
        local_950 = (BBoxRect *)
                    std::
                    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ::end(in_stack_fffffffffffff478);
        __position._M_current._4_4_ = in_stack_fffffffffffff4dc;
        __position._M_current._0_4_ = in_stack_fffffffffffff4d8;
        __first._M_current._4_4_ = in_stack_fffffffffffff4d4;
        __first._M_current._0_4_ = in_stack_fffffffffffff4d0;
        __last._M_current._4_4_ = in_stack_fffffffffffff4cc;
        __last._M_current._0_4_ = in_stack_fffffffffffff4c8;
        local_970._24_8_ =
             std::
             vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
             ::
             insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>,void>
                       (in_stack_fffffffffffff4c0,__position,__first,__last);
      }
      local_67c = 0;
    }
    else {
      local_5f4 = -1;
      local_67c = 1;
    }
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
               *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490));
    if (local_67c != 0) goto LAB_01a3059c;
  }
  qsort_descent_inplace
            ((Yolov3DetectionOutput *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
             (vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
              *)in_stack_fffffffffffff488);
  this_00 = (Mat *)local_970;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1a301e5);
  nms_sorted_bboxes((Yolov3DetectionOutput *)
                    CONCAT44(in_stack_fffffffffffff4d4,in_stack_fffffffffffff4d0),
                    (vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     *)CONCAT44(in_stack_fffffffffffff4cc,in_stack_fffffffffffff4c8),
                    (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_fffffffffffff4c0,in_stack_fffffffffffff4bc);
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            *)0x1a30216);
  local_990 = 0;
  while (sVar2 = local_990,
        sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_970),
        sVar2 < sVar3) {
    pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_970,local_990
                       );
    std::
    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ::operator[](&local_630,*pvVar4);
    std::
    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ::push_back((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                in_stack_fffffffffffff488);
    local_990 = local_990 + 1;
  }
  sVar3 = std::
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
          ::size(&local_988);
  if ((int)sVar3 == 0) {
    local_5f4 = 0;
  }
  else {
    pvVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_610,0);
    Mat::create(this_00,(int)(sVar2 >> 0x20),(int)sVar2,
                CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490),
                (Allocator *)in_stack_fffffffffffff488);
    in_stack_fffffffffffff497 = true;
    if (pvVar5->data != (void *)0x0) {
      in_stack_fffffffffffff497 = pvVar5->cstep * (long)pvVar5->c == 0;
      local_8 = pvVar5;
    }
    local_400 = pvVar5;
    if ((bool)in_stack_fffffffffffff497 == false) {
      for (local_9ac = 0; local_9ac < (int)sVar3; local_9ac = local_9ac + 1) {
        pvVar6 = std::
                 vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 ::operator[](&local_988,(long)local_9ac);
        fVar8 = pvVar6->score;
        local_41c = local_9ac;
        pfVar7 = (float *)((long)pvVar5->data + (long)pvVar5->w * (long)local_9ac * pvVar5->elemsize
                          );
        *pfVar7 = (float)(pvVar6->label + 1);
        pfVar7[1] = fVar8;
        pfVar7[2] = pvVar6->xmin;
        pfVar7[3] = pvVar6->ymin;
        pfVar7[4] = pvVar6->xmax;
        pfVar7[5] = pvVar6->ymax;
        local_418 = pvVar5;
      }
      local_5f4 = 0;
    }
    else {
      local_5f4 = -100;
    }
  }
  local_67c = 1;
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::~vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
             *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490));
LAB_01a3059c:
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::~vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
             *)CONCAT17(in_stack_fffffffffffff497,in_stack_fffffffffffff490));
  return local_5f4;
}

Assistant:

int Yolov3DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
        //printf("%d %d\n", net_w, net_h);

        //printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + exp(-box_score_ptr[0]) * (1.f + exp(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1); // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}